

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result wabt::ReadBinaryObjdump
                 (uint8_t *data,size_t size,ObjdumpOptions *options,ObjdumpState *state)

{
  Result RVar1;
  ReadBinaryOptions read_options;
  Features features;
  ReadBinaryOptions local_198;
  Features local_174;
  BinaryReaderObjdump local_168;
  
  local_174.exceptions_enabled_ = false;
  local_174.mutable_globals_enabled_ = true;
  local_174.sat_float_to_int_enabled_ = false;
  local_174.sign_extension_enabled_ = false;
  local_174.simd_enabled_ = false;
  local_174.threads_enabled_ = false;
  local_174.multi_value_enabled_ = false;
  local_174.tail_call_enabled_ = false;
  local_174.bulk_memory_enabled_ = false;
  local_174.reference_types_enabled_ = false;
  local_174.annotations_enabled_ = false;
  local_174.gc_enabled_ = false;
  Features::EnableAll(&local_174);
  local_198.log_stream = options->log_stream;
  local_198.features.annotations_enabled_ = local_174.annotations_enabled_;
  local_198.features.gc_enabled_ = local_174.gc_enabled_;
  local_198.features.bulk_memory_enabled_ = local_174.bulk_memory_enabled_;
  local_198.features.reference_types_enabled_ = local_174.reference_types_enabled_;
  local_198.features.sat_float_to_int_enabled_ = local_174.sat_float_to_int_enabled_;
  local_198.features.sign_extension_enabled_ = local_174.sign_extension_enabled_;
  local_198.features.simd_enabled_ = local_174.simd_enabled_;
  local_198.features.threads_enabled_ = local_174.threads_enabled_;
  local_198.features.multi_value_enabled_ = local_174.multi_value_enabled_;
  local_198.features.tail_call_enabled_ = local_174.tail_call_enabled_;
  local_198.features.exceptions_enabled_ = local_174.exceptions_enabled_;
  local_198.features.mutable_globals_enabled_ = local_174.mutable_globals_enabled_;
  local_198.read_debug_names = true;
  local_198.stop_on_first_error = false;
  local_198.fail_on_custom_section_error = false;
  local_168.super_BinaryReaderObjdumpBase.options_ = options;
  local_168.super_BinaryReaderObjdumpBase.objdump_state_ = state;
  local_168.super_BinaryReaderObjdumpBase.data_ = data;
  local_168.super_BinaryReaderObjdumpBase.size_ = size;
  if (options->mode == Disassemble) {
    local_168.super_BinaryReaderObjdumpBase.super_BinaryReaderNop.super_BinaryReaderDelegate.
    _vptr_BinaryReaderDelegate = (_func_int **)&PTR__BinaryReaderObjdumpBase_001507c0;
    local_168.out_stream_._M_t.
    super___uniq_ptr_impl<wabt::FileStream,_std::default_delete<wabt::FileStream>_>._M_t.
    super__Tuple_impl<0UL,_wabt::FileStream_*,_std::default_delete<wabt::FileStream>_>.
    super__Head_base<0UL,_wabt::FileStream_*,_false>._M_head_impl._0_4_ = 0;
    local_168._240_6_ = 0;
    local_168.table_index_._2_2_ = 0;
    local_168.next_data_reloc_ = 0;
    local_168.in_data_section_ = false;
    local_168.in_elem_section_ = false;
    local_168._254_2_ = 0;
    local_168.data_init_expr_.type = I32;
    local_168.data_init_expr_._4_8_ = 0;
  }
  else {
    if (options->mode != Prepass) {
      local_168.super_BinaryReaderObjdumpBase.module_name_._M_dataplus._M_p =
           (pointer)&local_168.super_BinaryReaderObjdumpBase.module_name_.field_2;
      local_168.super_BinaryReaderObjdumpBase.super_BinaryReaderNop.super_BinaryReaderDelegate.state
           = (State *)0x0;
      local_168.super_BinaryReaderObjdumpBase.print_details_ = false;
      local_168.super_BinaryReaderObjdumpBase.reloc_section_ = Invalid;
      local_168.super_BinaryReaderObjdumpBase.section_types_.
      super__Vector_base<wabt::BinarySection,_std::allocator<wabt::BinarySection>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_168.super_BinaryReaderObjdumpBase.section_types_.
      super__Vector_base<wabt::BinarySection,_std::allocator<wabt::BinarySection>_>._M_impl.
      super__Vector_impl_data._M_finish._0_1_ = 0;
      local_168.super_BinaryReaderObjdumpBase.section_types_.
      super__Vector_base<wabt::BinarySection,_std::allocator<wabt::BinarySection>_>._M_impl.
      super__Vector_impl_data._M_finish._1_7_ = 0;
      local_168.super_BinaryReaderObjdumpBase.section_types_.
      super__Vector_base<wabt::BinarySection,_std::allocator<wabt::BinarySection>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      local_168.super_BinaryReaderObjdumpBase._185_8_ = 0;
      local_168.super_BinaryReaderObjdumpBase.module_name_._M_string_length = 0;
      local_168.super_BinaryReaderObjdumpBase.module_name_.field_2._M_local_buf[0] = '\0';
      local_168.super_BinaryReaderObjdumpBase.section_starts_[0] = 0;
      local_168.super_BinaryReaderObjdumpBase.section_starts_[1] = 0;
      local_168.super_BinaryReaderObjdumpBase.section_starts_[2] = 0;
      local_168.super_BinaryReaderObjdumpBase.section_starts_[3] = 0;
      local_168.super_BinaryReaderObjdumpBase.section_starts_[4] = 0;
      local_168.super_BinaryReaderObjdumpBase.section_starts_[5] = 0;
      local_168.super_BinaryReaderObjdumpBase.section_starts_[6] = 0;
      local_168.super_BinaryReaderObjdumpBase.section_starts_[7] = 0;
      local_168.super_BinaryReaderObjdumpBase.section_starts_[8] = 0;
      local_168.super_BinaryReaderObjdumpBase.section_starts_[9] = 0;
      local_168.super_BinaryReaderObjdumpBase.section_starts_[10] = 0;
      local_168.super_BinaryReaderObjdumpBase.section_starts_[0xb] = 0;
      local_168.super_BinaryReaderObjdumpBase.section_starts_[0xc] = 0;
      local_168.super_BinaryReaderObjdumpBase.section_starts_[0xd] = 0;
      local_168.super_BinaryReaderObjdumpBase.super_BinaryReaderNop.super_BinaryReaderDelegate.
      _vptr_BinaryReaderDelegate = (_func_int **)&PTR__BinaryReaderObjdump_00150e48;
      FileStream::CreateStdout();
      local_168.data_flags_ = '\0';
      local_168.elem_flags_ = '\0';
      local_168.data_mem_index_ = 0;
      local_168.data_offset_ = 0;
      local_168.elem_offset_ = 0;
      local_168._240_6_ = 0;
      local_168.table_index_._2_2_ = 0;
      local_168.next_data_reloc_ = 0;
      local_168.in_data_section_ = false;
      local_168.in_elem_section_ = false;
      RVar1 = ReadBinary(data,size,(BinaryReaderDelegate *)&local_168,&local_198);
      anon_unknown_14::BinaryReaderObjdump::~BinaryReaderObjdump(&local_168);
      return (Result)RVar1.enum_;
    }
    local_168.super_BinaryReaderObjdumpBase.super_BinaryReaderNop.super_BinaryReaderDelegate.
    _vptr_BinaryReaderDelegate = (_func_int **)&PTR__BinaryReaderObjdumpBase_0014fab0;
  }
  local_168.super_BinaryReaderObjdumpBase.module_name_._M_dataplus._M_p =
       (pointer)&local_168.super_BinaryReaderObjdumpBase.module_name_.field_2;
  local_168.super_BinaryReaderObjdumpBase.module_name_.field_2._M_local_buf[0] = '\0';
  local_168.super_BinaryReaderObjdumpBase.module_name_._M_string_length = 0;
  local_168.super_BinaryReaderObjdumpBase._185_8_ = 0;
  local_168.super_BinaryReaderObjdumpBase.section_types_.
  super__Vector_base<wabt::BinarySection,_std::allocator<wabt::BinarySection>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_168.super_BinaryReaderObjdumpBase.section_types_.
  super__Vector_base<wabt::BinarySection,_std::allocator<wabt::BinarySection>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  local_168.super_BinaryReaderObjdumpBase.section_types_.
  super__Vector_base<wabt::BinarySection,_std::allocator<wabt::BinarySection>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  local_168.super_BinaryReaderObjdumpBase.section_types_.
  super__Vector_base<wabt::BinarySection,_std::allocator<wabt::BinarySection>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super_BinaryReaderObjdumpBase.section_starts_[0xd] = 0;
  local_168.super_BinaryReaderObjdumpBase.section_starts_[0xc] = 0;
  local_168.super_BinaryReaderObjdumpBase.section_starts_[0xb] = 0;
  local_168.super_BinaryReaderObjdumpBase.section_starts_[10] = 0;
  local_168.super_BinaryReaderObjdumpBase.section_starts_[9] = 0;
  local_168.super_BinaryReaderObjdumpBase.section_starts_[8] = 0;
  local_168.super_BinaryReaderObjdumpBase.section_starts_[7] = 0;
  local_168.super_BinaryReaderObjdumpBase.section_starts_[6] = 0;
  local_168.super_BinaryReaderObjdumpBase.section_starts_[5] = 0;
  local_168.super_BinaryReaderObjdumpBase.section_starts_[4] = 0;
  local_168.super_BinaryReaderObjdumpBase.section_starts_[3] = 0;
  local_168.super_BinaryReaderObjdumpBase.section_starts_[2] = 0;
  local_168.super_BinaryReaderObjdumpBase.section_starts_[1] = 0;
  local_168.super_BinaryReaderObjdumpBase.section_starts_[0] = 0;
  local_168.super_BinaryReaderObjdumpBase.reloc_section_ = Invalid;
  local_168.super_BinaryReaderObjdumpBase.print_details_ = false;
  local_168.super_BinaryReaderObjdumpBase.super_BinaryReaderNop.super_BinaryReaderDelegate.state =
       (State *)0x0;
  RVar1 = ReadBinary(data,size,(BinaryReaderDelegate *)&local_168,&local_198);
  anon_unknown_14::BinaryReaderObjdumpBase::~BinaryReaderObjdumpBase
            (&local_168.super_BinaryReaderObjdumpBase);
  return (Result)RVar1.enum_;
}

Assistant:

Result ReadBinaryObjdump(const uint8_t* data,
                         size_t size,
                         ObjdumpOptions* options,
                         ObjdumpState* state) {
  Features features;
  features.EnableAll();
  const bool kReadDebugNames = true;
  const bool kStopOnFirstError = false;
  const bool kFailOnCustomSectionError = false;
  ReadBinaryOptions read_options(features, options->log_stream, kReadDebugNames,
                                 kStopOnFirstError, kFailOnCustomSectionError);

  switch (options->mode) {
    case ObjdumpMode::Prepass: {
      BinaryReaderObjdumpPrepass reader(data, size, options, state);
      return ReadBinary(data, size, &reader, read_options);
    }
    case ObjdumpMode::Disassemble: {
      BinaryReaderObjdumpDisassemble reader(data, size, options, state);
      return ReadBinary(data, size, &reader, read_options);
    }
    default: {
      BinaryReaderObjdump reader(data, size, options, state);
      return ReadBinary(data, size, &reader, read_options);
    }
  }
}